

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

int fdb_validate_files(size_t num_filenames,char **filenames)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long in_RSI;
  ulong in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  iterator __end1;
  iterator __begin1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int valid_file_number;
  int compaction_no;
  string suffix;
  size_t last_dot_pos;
  string str;
  size_t i;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_filenames;
  fdb_config config;
  fdb_file_handle *fhandle;
  fdb_status s;
  undefined4 in_stack_fffffffffffffc98;
  fdb_status in_stack_fffffffffffffc9c;
  filemgr *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  _Self local_318;
  _Self local_310;
  undefined1 *local_308;
  int local_2fc;
  undefined1 local_2f8 [248];
  _Base_ptr local_200;
  undefined1 local_1f8;
  int local_1c4;
  string local_1c0 [36];
  int local_19c;
  long local_198;
  allocator local_179;
  string local_178 [32];
  ulong local_158;
  undefined1 local_150 [8];
  fdb_config *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  fdb_file_handle **in_stack_fffffffffffffec8;
  undefined1 local_120 [248];
  long *local_28;
  fdb_status local_1c;
  long local_18;
  ulong local_10;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x154aba);
    for (local_158 = 0; local_158 < local_10; local_158 = local_158 + 1) {
      pcVar3 = *(char **)(local_18 + local_158 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,pcVar3,&local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      local_198 = std::__cxx11::string::rfind((char *)local_178,0x18aa8c);
      if (local_198 == -1) {
        local_4 = -1;
        local_19c = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_178);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        local_1c4 = atoi(pcVar3);
        if ((local_1c4 == 0) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffca0,
                                    (char *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     in_stack_fffffffffffffc98)), bVar1)) {
          local_4 = -1;
          local_19c = 1;
        }
        else {
          std::make_pair<int&,std::__cxx11::string&>
                    ((int *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca0);
          _Var4 = std::
                  map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  ::insert<std::pair<int,std::__cxx11::string>>
                            ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
          local_200 = (_Base_ptr)_Var4.first._M_node;
          local_1f8 = _Var4.second;
          in_stack_fffffffffffffcb4 = CONCAT13(local_1f8,(int3)in_stack_fffffffffffffcb4);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x154ccc);
          local_19c = 0;
        }
        std::__cxx11::string::~string(local_1c0);
      }
      std::__cxx11::string::~string(local_178);
      if (local_19c != 0) goto LAB_00154f2e;
    }
    fdb_get_default_config();
    memcpy(local_120,local_2f8,0xf8);
    local_2fc = 0;
    local_308 = local_150;
    local_310._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    local_318._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    while( true ) {
      bVar1 = std::operator!=(&local_310,&local_318);
      if (!bVar1) break;
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x154dd5);
      std::__cxx11::string::c_str();
      local_1c = fdb_open(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
      if (local_1c != FDB_RESULT_SUCCESS) {
        local_2fc = local_2fc + -1;
        break;
      }
      bVar1 = filemgr_is_successfully_compacted(in_stack_fffffffffffffca0);
      if (!bVar1) {
        in_stack_fffffffffffffca0 = (filemgr *)**(undefined8 **)(*local_28 + 0x48);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcmp((char *)in_stack_fffffffffffffca0,pcVar3);
        if (iVar2 == 0) {
          local_1c = fdb_close((fdb_file_handle *)
                               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          break;
        }
      }
      local_2fc = local_2fc + 1;
      in_stack_fffffffffffffc9c =
           fdb_close((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      local_1c = in_stack_fffffffffffffc9c;
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffca0);
    }
    if ((int)local_10 <= local_2fc) {
      local_2fc = (int)local_10 + -1;
    }
    local_4 = local_2fc;
    local_19c = 1;
LAB_00154f2e:
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x154f3b);
  }
  return local_4;
}

Assistant:

LIBFDB_API
int fdb_validate_files(const size_t num_filenames,
                       const char** filenames) {
    fdb_status s;
    fdb_file_handle* fhandle;
    fdb_config config;

    if (!num_filenames || !filenames) {
        // Invalid arguments
        return -1;
    }

    // File name should be XXX.0, XXX.1, XXX.2, ...
    // Otherwise, it will result in undefined behavior.
    std::map<int, std::string> sorted_filenames;
    for (size_t i=0; i<num_filenames; ++i) {
        std::string str(filenames[i]);
        size_t last_dot_pos = str.rfind(".");
        if (last_dot_pos == std::string::npos) {
            // Invalid filename.
            return -1;
        }
        std::string suffix = str.substr(last_dot_pos+1);
        int compaction_no = atoi(suffix.c_str());
        if (compaction_no == 0 && suffix != "0") {
            // This means that suffix doesn't contain compaction number.
            return -1;
        }
        sorted_filenames.insert( std::make_pair(compaction_no, str) );
    }

    config = fdb_get_default_config();
    // Note: READ_ONLY flag prevents compaction recovery,
    //       so we open FDB file without it.

    int valid_file_number = 0;
    for (auto& entry: sorted_filenames) {
        s = fdb_open(&fhandle, entry.second.c_str(), &config);
        if (s != FDB_RESULT_SUCCESS) {
            // Broken file, previous file is the last valid one.
            valid_file_number--;
            break;
        }
        if (filemgr_is_successfully_compacted(fhandle->root->file) ||
            strcmp(fhandle->root->file->filename, entry.second.c_str())) {
            // 1) 'successfully_compacted' flag support version:
            //    -> just check flag
            // 2) Otherwise: if opened file name is different
            //    to original -> this implies that compaction succeeded.
            valid_file_number++;
            s = fdb_close(fhandle);
        } else {
            s = fdb_close(fhandle);
            break;
        }
    }

    if (valid_file_number >= (int)num_filenames) {
        // All files are valid.
        // Return the last index number.
        valid_file_number = num_filenames - 1;
    }

    return valid_file_number;
}